

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryLambdaWrapper,bool,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t)>
               (interval_t *ldata,date_t *rdata,date_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,_func_date_t_interval_t_date_t *fun)

{
  interval_t left;
  interval_t left_00;
  bool bVar1;
  date_t dVar2;
  idx_t iVar3;
  undefined8 *puVar4;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  date_t rentry_1;
  interval_t lentry_1;
  idx_t i_1;
  date_t rentry;
  interval_t lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff38;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff40;
  long lVar5;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  ValidityMask *in_stack_ffffffffffffff58;
  _func_date_t_interval_t_date_t *in_stack_ffffffffffffff60;
  date_t in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  ValidityMask *mask;
  int64_t in_stack_ffffffffffffff78;
  _func_date_t_interval_t_date_t *fun_00;
  ulong local_80;
  ulong local_38;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_80 = 0; local_80 < in_R9; local_80 = local_80 + 1) {
      lVar5 = in_RDI;
      iVar3 = SelectionVector::get_index(in_RCX,local_80);
      puVar4 = (undefined8 *)(lVar5 + iVar3 * 0x10);
      mask = (ValidityMask *)*puVar4;
      fun_00 = (_func_date_t_interval_t_date_t *)puVar4[1];
      lVar5 = in_RSI;
      iVar3 = SelectionVector::get_index(in_R8,local_80);
      dVar2.days = *(int32_t *)(lVar5 + iVar3 * 4);
      left_00.micros = (int64_t)fun_00;
      left_00._0_8_ = mask;
      dVar2 = BinaryLambdaWrapper::
              Operation<duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t),bool,duckdb::interval_t,duckdb::date_t,duckdb::date_t>
                        (fun_00,left_00,dVar2,mask,CONCAT44(dVar2.days,in_stack_ffffffffffffff50));
      *(int32_t *)(in_RDX + local_80 * 4) = dVar2.days;
    }
  }
  else {
    for (local_38 = 0; local_38 < in_R9; local_38 = local_38 + 1) {
      SelectionVector::get_index(in_RCX,local_38);
      SelectionVector::get_index(in_R8,local_38);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff48,(idx_t)in_stack_ffffffffffffff40);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff48,(idx_t)in_stack_ffffffffffffff40), bVar1)) {
        left.micros = in_stack_ffffffffffffff78;
        left.months = (int)in_stack_ffffffffffffff70;
        left.days = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
        dVar2 = BinaryLambdaWrapper::
                Operation<duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t),bool,duckdb::interval_t,duckdb::date_t,duckdb::date_t>
                          (in_stack_ffffffffffffff60,left,in_stack_ffffffffffffff6c,
                           in_stack_ffffffffffffff58,
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        *(int32_t *)(in_RDX + local_38 * 4) = dVar2.days;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}